

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void testing::internal::JsonUnitTestResultPrinter::PrintJsonUnitTest
               (ostream *stream,UnitTest *unit_test)

{
  UnitTestImpl *pUVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  ostream *poVar5;
  TestSuite *pTVar6;
  size_t width;
  TimeInMillis ms;
  TimeInMillis ms_00;
  int i;
  undefined1 local_c0 [8];
  string kTestsuites;
  string kIndent;
  allocator local_59;
  string local_58;
  allocator local_31;
  
  std::__cxx11::string::string
            ((string *)local_c0,"testsuites",(allocator *)(kTestsuites.field_2._M_local_buf + 8));
  Indent_abi_cxx11_((string *)((long)&kTestsuites.field_2 + 8),(internal *)0x2,width);
  std::operator<<(stream,"{\n");
  std::__cxx11::string::string
            ((string *)&local_58,"tests",(allocator *)(kIndent.field_2._M_local_buf + 8));
  iVar3 = UnitTest::reportable_test_count(unit_test);
  OutputJsonKey(stream,(string *)local_c0,&local_58,iVar3,(string *)((long)&kTestsuites.field_2 + 8)
                ,true);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::string
            ((string *)&local_58,"failures",(allocator *)(kIndent.field_2._M_local_buf + 8));
  iVar3 = UnitTest::failed_test_count(unit_test);
  OutputJsonKey(stream,(string *)local_c0,&local_58,iVar3,(string *)((long)&kTestsuites.field_2 + 8)
                ,true);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::string
            ((string *)&local_58,"disabled",(allocator *)(kIndent.field_2._M_local_buf + 8));
  iVar3 = UnitTest::reportable_disabled_test_count(unit_test);
  OutputJsonKey(stream,(string *)local_c0,&local_58,iVar3,(string *)((long)&kTestsuites.field_2 + 8)
                ,true);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::string
            ((string *)&local_58,"errors",(allocator *)(kIndent.field_2._M_local_buf + 8));
  OutputJsonKey(stream,(string *)local_c0,&local_58,0,(string *)((long)&kTestsuites.field_2 + 8),
                true);
  std::__cxx11::string::~string((string *)&local_58);
  if (FLAGS_gtest_shuffle == '\x01') {
    std::__cxx11::string::string
              ((string *)&local_58,"random_seed",(allocator *)(kIndent.field_2._M_local_buf + 8));
    OutputJsonKey(stream,(string *)local_c0,&local_58,unit_test->impl_->random_seed_,
                  (string *)((long)&kTestsuites.field_2 + 8),true);
    std::__cxx11::string::~string((string *)&local_58);
  }
  std::__cxx11::string::string((string *)&local_58,"timestamp",&local_31);
  FormatEpochTimeInMillisAsRFC3339_abi_cxx11_
            ((string *)((long)&kIndent.field_2 + 8),(internal *)unit_test->impl_->start_timestamp_,
             ms);
  OutputJsonKey(stream,(string *)local_c0,&local_58,(string *)((long)&kIndent.field_2 + 8),
                (string *)((long)&kTestsuites.field_2 + 8),true);
  std::__cxx11::string::~string((string *)(kIndent.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::string((string *)&local_58,"time",&local_31);
  FormatTimeInMillisAsDuration_abi_cxx11_
            ((string *)((long)&kIndent.field_2 + 8),(internal *)unit_test->impl_->elapsed_time_,
             ms_00);
  OutputJsonKey(stream,(string *)local_c0,&local_58,(string *)((long)&kIndent.field_2 + 8),
                (string *)((long)&kTestsuites.field_2 + 8),false);
  std::__cxx11::string::~string((string *)(kIndent.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&local_58);
  TestPropertiesAsJson
            (&local_58,&unit_test->impl_->ad_hoc_test_result_,
             (string *)((long)&kTestsuites.field_2 + 8));
  poVar5 = std::operator<<(stream,(string *)&local_58);
  std::operator<<(poVar5,",\n");
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::string((string *)&local_58,"name",&local_31);
  std::__cxx11::string::string((string *)(kIndent.field_2._M_local_buf + 8),"AllTests",&local_59);
  OutputJsonKey(stream,(string *)local_c0,&local_58,(string *)((long)&kIndent.field_2 + 8),
                (string *)((long)&kTestsuites.field_2 + 8),true);
  std::__cxx11::string::~string((string *)(kIndent.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&local_58);
  poVar5 = std::operator<<(stream,(string *)(kTestsuites.field_2._M_local_buf + 8));
  poVar5 = std::operator<<(poVar5,"\"");
  poVar5 = std::operator<<(poVar5,(string *)local_c0);
  std::operator<<(poVar5,"\": [\n");
  bVar2 = false;
  for (iVar3 = 0; pUVar1 = unit_test->impl_,
      iVar3 < (int)((ulong)((long)(pUVar1->test_suites_).
                                  super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(pUVar1->test_suites_).
                                 super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 3); iVar3 = iVar3 + 1
      ) {
    pTVar6 = UnitTest::GetTestSuite(unit_test,iVar3);
    iVar4 = TestSuite::reportable_test_count(pTVar6);
    if (0 < iVar4) {
      if (bVar2) {
        std::operator<<(stream,",\n");
      }
      pTVar6 = UnitTest::GetTestSuite(unit_test,iVar3);
      bVar2 = true;
      PrintJsonTestSuite(stream,pTVar6);
    }
  }
  bVar2 = TestResult::Failed(&pUVar1->ad_hoc_test_result_);
  if (bVar2) {
    OutputJsonTestSuiteForTestResult(stream,&unit_test->impl_->ad_hoc_test_result_);
  }
  poVar5 = std::operator<<(stream,"\n");
  poVar5 = std::operator<<(poVar5,(string *)(kTestsuites.field_2._M_local_buf + 8));
  poVar5 = std::operator<<(poVar5,"]\n");
  std::operator<<(poVar5,"}\n");
  std::__cxx11::string::~string((string *)(kTestsuites.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_c0);
  return;
}

Assistant:

void JsonUnitTestResultPrinter::PrintJsonUnitTest(std::ostream* stream,
                                                  const UnitTest& unit_test) {
  const std::string kTestsuites = "testsuites";
  const std::string kIndent = Indent(2);
  *stream << "{\n";

  OutputJsonKey(stream, kTestsuites, "tests", unit_test.reportable_test_count(),
                kIndent);
  OutputJsonKey(stream, kTestsuites, "failures", unit_test.failed_test_count(),
                kIndent);
  OutputJsonKey(stream, kTestsuites, "disabled",
                unit_test.reportable_disabled_test_count(), kIndent);
  OutputJsonKey(stream, kTestsuites, "errors", 0, kIndent);
  if (GTEST_FLAG(shuffle)) {
    OutputJsonKey(stream, kTestsuites, "random_seed", unit_test.random_seed(),
                  kIndent);
  }
  OutputJsonKey(stream, kTestsuites, "timestamp",
                FormatEpochTimeInMillisAsRFC3339(unit_test.start_timestamp()),
                kIndent);
  OutputJsonKey(stream, kTestsuites, "time",
                FormatTimeInMillisAsDuration(unit_test.elapsed_time()), kIndent,
                false);

  *stream << TestPropertiesAsJson(unit_test.ad_hoc_test_result(), kIndent)
          << ",\n";

  OutputJsonKey(stream, kTestsuites, "name", "AllTests", kIndent);
  *stream << kIndent << "\"" << kTestsuites << "\": [\n";

  bool comma = false;
  for (int i = 0; i < unit_test.total_test_suite_count(); ++i) {
    if (unit_test.GetTestSuite(i)->reportable_test_count() > 0) {
      if (comma) {
        *stream << ",\n";
      } else {
        comma = true;
      }
      PrintJsonTestSuite(stream, *unit_test.GetTestSuite(i));
    }
  }

  // If there was a test failure outside of one of the test suites (like in a
  // test environment) include that in the output.
  if (unit_test.ad_hoc_test_result().Failed()) {
    OutputJsonTestSuiteForTestResult(stream, unit_test.ad_hoc_test_result());
  }

  *stream << "\n" << kIndent << "]\n" << "}\n";
}